

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::compiler::CodeGeneratorRequest::_InternalParse
          (CodeGeneratorRequest *this,char *ptr,ParseContext *ctx)

{
  uint uVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  string *s_00;
  Version *msg;
  FileDescriptorProto *msg_00;
  UnknownFieldSet *unknown;
  char cVar3;
  ulong tag_00;
  uint32_t tag;
  char *local_48;
  uint local_3c;
  InternalMetadata *local_38;
  
  local_38 = &(this->super_Message).super_MessageLite._internal_metadata_;
  local_48 = ptr;
LAB_002bd594:
  bVar2 = internal::ParseContext::Done(ctx,&local_48);
  if (bVar2) {
    return local_48;
  }
  local_48 = internal::ReadTag(local_48,&local_3c,0);
  tag_00 = (ulong)local_3c;
  uVar1 = local_3c >> 3;
  cVar3 = (char)local_3c;
  if (uVar1 == 0xf) {
    if (cVar3 == 'z') {
      local_48 = local_48 + -1;
      do {
        local_48 = local_48 + 1;
        msg_00 = RepeatedPtrField<google::protobuf::FileDescriptorProto>::Add(&this->proto_file_);
        local_48 = internal::ParseContext::ParseMessage(ctx,(MessageLite *)msg_00,local_48);
        if (local_48 == (char *)0x0) {
          return (char *)0x0;
        }
      } while ((local_48 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_48 == 'z'));
      goto LAB_002bd594;
    }
  }
  else {
    if (uVar1 == 2) {
      if (cVar3 != '\x12') goto LAB_002bd6ec;
      s_00 = _internal_mutable_parameter_abi_cxx11_(this);
      local_48 = internal::InlineGreedyStringParser(s_00,local_48,ctx);
      internal::VerifyUTF8(s_00,"google.protobuf.compiler.CodeGeneratorRequest.parameter");
      goto joined_r0x002bd67f;
    }
    if (uVar1 != 3) {
      if ((uVar1 != 1) || (cVar3 != '\n')) goto LAB_002bd6ec;
      local_48 = local_48 + -1;
      do {
        local_48 = local_48 + 1;
        s = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Add(&this->file_to_generate_);
        local_48 = internal::InlineGreedyStringParser(s,local_48,ctx);
        internal::VerifyUTF8(s,"google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
        if (local_48 == (char *)0x0) {
          return (char *)0x0;
        }
      } while ((local_48 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_48 == '\n'));
      goto LAB_002bd594;
    }
    if (cVar3 == '\x1a') {
      msg = _internal_mutable_compiler_version(this);
      local_48 = internal::ParseContext::ParseMessage(ctx,(MessageLite *)msg,local_48);
      goto joined_r0x002bd67f;
    }
  }
LAB_002bd6ec:
  if ((tag_00 == 0) || ((local_3c & 7) == 4)) {
    if (local_48 == (char *)0x0) {
      return (char *)0x0;
    }
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
    return local_48;
  }
  unknown = internal::InternalMetadata::mutable_unknown_fields<google::protobuf::UnknownFieldSet>
                      (local_38);
  local_48 = internal::UnknownFieldParse(tag_00,unknown,local_48,ctx);
joined_r0x002bd67f:
  if (local_48 == (char *)0x0) {
    return (char *)0x0;
  }
  goto LAB_002bd594;
}

Assistant:

const char* CodeGeneratorRequest::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated string file_to_generate = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            auto str = _internal_add_file_to_generate();
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
            #ifndef NDEBUG
            ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
            #endif  // !NDEBUG
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else
          goto handle_unusual;
        continue;
      // optional string parameter = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          auto str = _internal_mutable_parameter();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.compiler.CodeGeneratorRequest.parameter");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // optional .google.protobuf.compiler.Version compiler_version = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_compiler_version(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
      case 15:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 122)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_proto_file(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<122>(ptr));
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}